

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::CleanUpInlineCaches<true>(FunctionBody *this)

{
  InlineCache *pIVar1;
  IsInstInlineCache *this_00;
  FunctionCodeGenRuntimeData *pFVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  void *pvVar9;
  undefined4 *puVar10;
  FunctionBodyPolymorphicInlineCache *this_01;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  FunctionCodeGenRuntimeData *local_40;
  Type runtimeData;
  uint unregisteredInlineCacheCount;
  
  runtimeData.ptr._4_4_ = 0;
  if ((this->inlineCaches).ptr != (void **)0x0) {
    uVar6 = GetCountField(this,RootObjectLoadInlineCacheStart);
    uVar11 = (ulong)uVar6;
    if (uVar6 != 0) {
      uVar13 = 0;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar13];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
    GetRootObject(this);
    uVar7 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
    iVar12 = uVar7 - uVar6;
    if (uVar6 <= uVar7 && iVar12 != 0) {
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar11];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar11 = uVar11 + 1;
        iVar12 = iVar12 + -1;
        uVar6 = uVar7;
      } while (iVar12 != 0);
    }
    uVar7 = GetCountField(this,RootObjectStoreInlineCacheStart);
    iVar12 = uVar7 - uVar6;
    if (uVar6 <= uVar7 && iVar12 != 0) {
      uVar11 = (ulong)uVar6;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar11];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar11 = uVar11 + 1;
        iVar12 = iVar12 + -1;
        uVar6 = uVar7;
      } while (iVar12 != 0);
    }
    uVar7 = GetCountField(this,InlineCacheCount);
    iVar12 = uVar7 - uVar6;
    if (uVar6 <= uVar7 && iVar12 != 0) {
      uVar11 = (ulong)uVar6;
      do {
        pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar11];
        if (pIVar1 != (InlineCache *)0x0) {
          InlineCache::Clear(pIVar1);
        }
        uVar11 = uVar11 + 1;
        iVar12 = iVar12 + -1;
        uVar6 = uVar7;
      } while (iVar12 != 0);
    }
    uVar7 = GetCountField(this,InlineCacheCount);
    uVar8 = GetCountField(this,IsInstInlineCacheCount);
    if (uVar6 < uVar8 + uVar7) {
      uVar11 = (ulong)uVar6;
      iVar12 = (uVar8 + uVar7) - uVar6;
      do {
        this_00 = (IsInstInlineCache *)(this->inlineCaches).ptr[uVar11];
        if (this_00 != (IsInstInlineCache *)0x0) {
          IsInstInlineCache::Clear(this_00);
        }
        uVar11 = uVar11 + 1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    (this->inlineCaches).ptr = (void **)0x0;
  }
  pvVar9 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenRuntimeData);
  if ((pvVar9 != (void *)0x0) && (uVar5 = this->profiledCallSiteCount, uVar5 != 0)) {
    uVar11 = 0;
    do {
      pFVar2 = *(FunctionCodeGenRuntimeData **)((long)pvVar9 + uVar11 * 8);
      if (pFVar2 != (FunctionCodeGenRuntimeData *)0x0) {
        fn.this = this;
        fn.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_1_>
                  (pFVar2,fn);
        uVar5 = this->profiledCallSiteCount;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar5);
  }
  pvVar9 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
  if ((pvVar9 != (void *)0x0) && (uVar6 = GetCountField(this,InlineCacheCount), uVar6 != 0)) {
    uVar11 = 0;
    do {
      pFVar2 = *(FunctionCodeGenRuntimeData **)((long)pvVar9 + uVar11 * 8);
      Memory::Recycler::WBSetBit((char *)&local_40);
      local_40 = pFVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
      if (local_40 != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_2_>
                  (local_40,fn_00);
      }
      uVar11 = uVar11 + 1;
      uVar6 = GetCountField(this,InlineCacheCount);
    } while (uVar11 < uVar6);
  }
  if (runtimeData.ptr._4_4_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1db7,"(!IsScriptContextShutdown)",
                                "Unregistration of inlineCache should only be done if this is not scriptContext shutdown."
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
    ThreadContext::NotifyInlineCacheBatchUnregistered
              (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               threadContext,runtimeData.ptr._4_4_);
  }
  while (pvVar9 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead),
        pvVar9 != (void *)0x0) {
    this_01 = (FunctionBodyPolymorphicInlineCache *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead);
    FunctionBodyPolymorphicInlineCache::Finalize(this_01,true);
  }
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }